

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkclean.c
# Opt level: O1

void UpdateCues(ebml_master *Cues,ebml_master *Segment)

{
  matroska_cuepoint *pmVar1;
  matroska_cuepoint *Cue;
  err_t eVar2;
  
  pmVar1 = (matroska_cuepoint *)(Cues->Base).Base.Children;
  while( true ) {
    Cue = pmVar1;
    if (Cue == (matroska_cuepoint *)0x0) {
      return;
    }
    pmVar1 = (matroska_cuepoint *)(Cue->Base).Base.Base.Next;
    if (Cue == pmVar1) break;
    eVar2 = MATROSKA_CuePointUpdate(Cue,&Segment->Base,DstProfile);
    if (eVar2 != 0) {
      NodeDelete((node *)Cue);
    }
  }
  __assert_fail("(nodetree*)(Cue) != ((nodetree*)(Cue))->Next",
                "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/mkclean/mkclean.c"
                ,0x158,"void UpdateCues(ebml_master *, ebml_master *)");
}

Assistant:

static void UpdateCues(ebml_master *Cues, ebml_master *Segment)
{
    ebml_master *Cue,*NextCue;

    // reevaluate the size needed for the Cues
    for (Cue=(ebml_master*)EBML_MasterChildren(Cues);Cue;Cue=NextCue)
    {
        NextCue =(ebml_master*)EBML_MasterNext(Cue);
        if (MATROSKA_CuePointUpdate((matroska_cuepoint*)Cue, (ebml_element*)Segment, DstProfile)!=ERR_NONE)
        {
            NodeDelete((node*)Cue);
        }
    }
}